

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocNegativeLinkMaxMaxNumOfLocation::Run
          (UniformLocNegativeLinkMaxMaxNumOfLocation *this)

{
  long lVar1;
  DefOccurence local_568;
  DefOccurence local_564;
  LayoutSpecifierBase local_560;
  LayoutSpecifierBase local_550;
  UniformType local_540;
  Uniform local_4b0;
  LayoutSpecifierBase local_2d8;
  DefOccurence local_2c8;
  DefOccurence local_2c4;
  LayoutSpecifierBase local_2c0;
  LayoutSpecifierBase local_2b0;
  UniformType local_298;
  Uniform local_208;
  undefined1 local_30 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  GLint max;
  UniformLocNegativeLinkMaxMaxNumOfLocation *this_local;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x826e,
             (GLint *)((long)&uniforms.
                              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_30);
  UniformType::UniformType
            (&local_298,0x1406,
             uniforms.
             super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_2c0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0,Dec);
  local_2b0 = local_2c0;
  DefOccurence::DefOccurence(&local_2c4,FSH_OR_CSH);
  DefOccurence::DefOccurence(&local_2c8,NONE_SH);
  local_2d8 = local_2b0;
  anon_unknown_0::Uniform::Uniform
            (&local_208,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_298,(Loc)local_2b0,local_2c4,local_2c8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_30,&local_208);
  anon_unknown_0::Uniform::~Uniform(&local_208);
  UniformType::~UniformType(&local_298);
  UniformType::UniformType(&local_540,0x1406,0);
  local_560 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_550 = local_560;
  DefOccurence::DefOccurence(&local_564,ALL_BUT_FSH);
  DefOccurence::DefOccurence(&local_568,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_4b0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_540,(Loc)local_550,local_564,local_568);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_30,&local_4b0);
  anon_unknown_0::Uniform::~Uniform(&local_4b0);
  UniformType::~UniformType(&local_540);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_30);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_30);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, max), Loc::C(0),
								   DefOccurence::FSH_OR_CSH, DefOccurence::NONE_SH));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::Implicit(), DefOccurence::ALL_BUT_FSH));
		return doRunNegativeLink(uniforms);
	}